

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O3

void __thiscall cdplayer::add_transitions(cdplayer *this,state_machine<cdplayer> *sm)

{
  state_conditions *psVar1;
  state_type *psVar2;
  anon_class_1_0_00000001 cond;
  _Bind<bool_(cdplayer::*(cdplayer_*,_std::_Placeholder<1>))(const_cdplayer::inputs_type_&)>
  local_48;
  
  psVar1 = &(sm->state_switches_)._M_elems[0].switch_conditions_m;
  (sm->state_switches_)._M_elems[0].switch_conditions_m.from_state_m = off;
  (sm->state_switches_)._M_elems[0].switch_conditions_m.current_switch_to_state_m = on;
  (sm->state_switches_)._M_elems[0].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  local_48._M_f = (offset_in_cdplayer_to_subr)power_toggle;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)sm;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,
             &(sm->state_switches_)._M_elems[0].switch_conditions_m.current_switch_to_state_m);
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<estl::state_machine<cdplayer>::state_conditions::otherwise_loop()::_lambda(cdplayer::inputs_type_const&)_1_const&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,(anon_class_1_0_00000001 *)&local_48,
             &(sm->state_switches_)._M_elems[0].switch_conditions_m.from_state_m);
  psVar1 = &(sm->state_switches_)._M_elems[1].switch_conditions_m;
  (sm->state_switches_)._M_elems[1].switch_conditions_m.from_state_m = on;
  (sm->state_switches_)._M_elems[1].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[1].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  psVar2 = &(sm->state_switches_)._M_elems[1].switch_conditions_m.current_switch_to_state_m;
  local_48._M_f = (offset_in_cdplayer_to_subr)power_toggle;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)sm;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  (sm->state_switches_)._M_elems[1].switch_conditions_m.current_switch_to_state_m = playing;
  local_48._M_f = (offset_in_cdplayer_to_subr)play_pressed;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (sm->state_switches_)._M_elems[1].switch_conditions_m.state_machine_m;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<estl::state_machine<cdplayer>::state_conditions::otherwise_loop()::_lambda(cdplayer::inputs_type_const&)_1_const&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,(anon_class_1_0_00000001 *)&local_48,
             &(sm->state_switches_)._M_elems[1].switch_conditions_m.from_state_m);
  psVar1 = &(sm->state_switches_)._M_elems[2].switch_conditions_m;
  (sm->state_switches_)._M_elems[2].switch_conditions_m.from_state_m = playing;
  (sm->state_switches_)._M_elems[2].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[2].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  psVar2 = &(sm->state_switches_)._M_elems[2].switch_conditions_m.current_switch_to_state_m;
  local_48._M_f = (offset_in_cdplayer_to_subr)power_toggle;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)sm;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  (sm->state_switches_)._M_elems[2].switch_conditions_m.current_switch_to_state_m = paused;
  local_48._M_f = (offset_in_cdplayer_to_subr)play_pressed;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (sm->state_switches_)._M_elems[2].switch_conditions_m.state_machine_m;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<estl::state_machine<cdplayer>::state_conditions::otherwise_loop()::_lambda(cdplayer::inputs_type_const&)_1_const&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,(anon_class_1_0_00000001 *)&local_48,
             &(sm->state_switches_)._M_elems[2].switch_conditions_m.from_state_m);
  psVar1 = &(sm->state_switches_)._M_elems[3].switch_conditions_m;
  (sm->state_switches_)._M_elems[3].switch_conditions_m.from_state_m = paused;
  (sm->state_switches_)._M_elems[3].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[3].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  psVar2 = &(sm->state_switches_)._M_elems[3].switch_conditions_m.current_switch_to_state_m;
  local_48._M_f = (offset_in_cdplayer_to_subr)power_toggle;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)sm;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  (sm->state_switches_)._M_elems[3].switch_conditions_m.current_switch_to_state_m = playing;
  local_48._M_f = (offset_in_cdplayer_to_subr)play_pressed;
  local_48._8_8_ = 0;
  local_48._M_bound_args.super__Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_cdplayer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cdplayer_*,_std::_Placeholder<1>_>)
       (sm->state_switches_)._M_elems[3].switch_conditions_m.state_machine_m;
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<std::_Bind<bool(cdplayer::*(cdplayer*,std::_Placeholder<1>))(cdplayer::inputs_type_const&)>&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,&local_48,psVar2);
  std::
  vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
  ::
  emplace_back<estl::state_machine<cdplayer>::state_conditions::otherwise_loop()::_lambda(cdplayer::inputs_type_const&)_1_const&,cdplayer::state_type&>
            ((vector<estl::state_machine<cdplayer>::condition,std::allocator<estl::state_machine<cdplayer>::condition>>
              *)psVar1,(anon_class_1_0_00000001 *)&local_48,
             &(sm->state_switches_)._M_elems[3].switch_conditions_m.from_state_m);
  return;
}

Assistant:

void add_transitions(estl::state_machine<cdplayer>& sm)
    {
        // --- Transitions from off ---
        sm.transitions_from(state_type::off)
                .switch_to(state_type::on).when(&cdplayer::power_toggle)
                .otherwise_loop();

        // --- Transitions from on ---
        sm.transitions_from(state_type::on)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from playing ---
        sm.transitions_from(state_type::playing)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::paused).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from paused ---
        sm.transitions_from(state_type::paused)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();
    }